

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextMarkerGenerator::PrintMarker
          (TextMarkerGenerator *this,BaseTextGenerator *generator,bool redact,bool randomize,
          bool single_line_mode)

{
  const_pointer pvVar1;
  size_type sVar2;
  bool single_line_mode_local;
  bool randomize_local;
  bool redact_local;
  BaseTextGenerator *generator_local;
  TextMarkerGenerator *this_local;
  
  if (redact) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&this->redaction_marker_);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->redaction_marker_);
    (*generator->_vptr_BaseTextGenerator[5])(generator,pvVar1,sVar2);
  }
  if (randomize) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&this->random_marker_);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->random_marker_);
    (*generator->_vptr_BaseTextGenerator[5])(generator,pvVar1,sVar2);
  }
  if (((redact) || (randomize)) && (!single_line_mode)) {
    TextFormat::BaseTextGenerator::PrintLiteral<2ul>(generator,(char (*) [2])0x68ffb3);
  }
  return;
}

Assistant:

void PrintMarker(TextFormat::BaseTextGenerator* generator, bool redact,
                   bool randomize, bool single_line_mode) const {
    if (redact) {
      generator->Print(redaction_marker_.data(), redaction_marker_.size());
    }
    if (randomize) {
      generator->Print(random_marker_.data(), random_marker_.size());
    }
    if ((redact || randomize) && !single_line_mode) {
      generator->PrintLiteral("\n");
    }
  }